

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<3>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  uint64 *puVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  puVar1 = (uint64 *)Get<long>(ptr);
  io::CodedOutputStream::WriteVarint64(output,*puVar1);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt64NoTag(Get<int64>(ptr), output);
  }